

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* list_files(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *folder,string *prefix)

{
  size_t *psVar1;
  size_type sVar2;
  int iVar3;
  DIR *__dirp;
  dirent *pdVar4;
  size_t sVar5;
  _Node *p_Var6;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  __dirp = opendir((folder->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    sVar2 = prefix->_M_string_length;
    while( true ) {
      pdVar4 = readdir(__dirp);
      if (pdVar4 == (dirent *)0x0) break;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar5 = strlen(pdVar4->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pdVar4->d_name,pdVar4->d_name + sVar5);
      if ((sVar2 != 0) && (sVar5 = prefix->_M_string_length, sVar5 <= local_50._M_string_length)) {
        if (sVar5 != 0) {
          iVar3 = bcmp((prefix->_M_dataplus)._M_p,local_50._M_dataplus._M_p,sVar5);
          if (iVar3 != 0) goto LAB_001145e9;
        }
        p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string_const&>
                           ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            __return_storage_ptr__,&local_50);
        std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
        psVar1 = &(__return_storage_ptr__->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
LAB_001145e9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    closedir(__dirp);
  }
  return __return_storage_ptr__;
}

Assistant:

list<string> list_files(const string &folder, const string &prefix) {
    struct dirent *entry;
    list<string> retval;
    DIR *dir = opendir(folder.c_str());
    if (dir == nullptr) {
        return retval;
    }

    bool check_prefix = prefix.length() > 0;

    while ((entry = readdir(dir)) != nullptr) {
        string filename = entry->d_name;
        if (check_prefix && starts_with(filename, prefix)) {
            retval.push_back(filename);
        }
    }
    closedir(dir);

    return retval;
}